

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPipelineViewportDepthClipControlCreateInfoEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineViewportDepthClipControlCreateInfoEXT>
          (Impl *this,VkPipelineViewportDepthClipControlCreateInfoEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPipelineViewportDepthClipControlCreateInfoEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPipelineViewportDepthClipControlCreateInfoEXT>
                       (alloc,count);
    if (pVVar1 != (VkPipelineViewportDepthClipControlCreateInfoEXT *)0x0) {
      pVVar1 = (VkPipelineViewportDepthClipControlCreateInfoEXT *)memmove(pVVar1,src,count * 0x18);
      return pVVar1;
    }
  }
  return (VkPipelineViewportDepthClipControlCreateInfoEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}